

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O0

String * kj::_::anon_unknown_2::makeDescriptionImpl
                   (String *__return_storage_ptr__,DescriptionStyle style,char *code,int errorNumber
                   ,char *sysErrorString,char *macroArgs,ArrayPtr<kj::String> argValues)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  kj *this;
  size_t sVar4;
  ArrayPtr<const_char> *pAVar5;
  ExceptionCallback *pEVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  String *pSVar10;
  char *pcVar11;
  size_t size;
  ArrayPtr<kj::ArrayPtr<const_char>_> AVar12;
  ArrayPtr<const_char> AVar13;
  char *in_stack_fffffffffffff9c8;
  ArrayPtr<const_char> *local_3b0;
  StringPtr local_3a8;
  ArrayPtr<const_char> local_398;
  ArrayPtr<const_char> local_388;
  ulong local_378;
  size_t i_1;
  char *pos_1;
  StringPtr local_360;
  ArrayPtr<const_char> local_350;
  ArrayPtr<const_char> local_340;
  ulong local_330;
  size_t i;
  size_t sStack_320;
  anon_class_1_0_00000001 needsLabel;
  size_t totalSize;
  char *local_310;
  StringPtr local_308;
  char local_2f8 [8];
  char buffer [256];
  undefined1 local_1f0 [8];
  StringPtr sysErrorArray;
  StringPtr closeBracket;
  StringPtr openBracket;
  StringPtr colon;
  StringPtr delim;
  StringPtr sep;
  StringPtr codeArray;
  StringPtr expected;
  char *equalsPos;
  size_t local_160;
  String local_158;
  ArrayPtr<const_char> local_140;
  ArrayPtr<const_char> local_130;
  char local_11e;
  byte local_11d;
  int local_11c;
  char c;
  bool quoted;
  char *pcStack_118;
  uint depth;
  char *pos;
  char *start;
  size_t index;
  undefined1 local_f0 [8];
  ArrayPtr<kj::ArrayPtr<const_char>_> argNames;
  Array<kj::ArrayPtr<const_char>_> argNames_heap;
  ArrayPtr<const_char> argNames_stack [8];
  bool argNames_isOnStack;
  size_t argNames_size;
  char *macroArgs_local;
  char *sysErrorString_local;
  char *pcStack_20;
  int errorNumber_local;
  char *code_local;
  String *pSStack_10;
  DescriptionStyle style_local;
  String *result;
  
  argNames_size = (size_t)macroArgs;
  macroArgs_local = sysErrorString;
  sysErrorString_local._4_4_ = errorNumber;
  pcStack_20 = code;
  code_local._4_4_ = style;
  pSStack_10 = __return_storage_ptr__;
  this = (kj *)ArrayPtr<kj::String>::size(&argValues);
  argNames_stack[7].size_._7_1_ = this < (kj *)0x9;
  local_3b0 = (ArrayPtr<const_char> *)&argNames_heap.disposer;
  do {
    ArrayPtr<const_char>::ArrayPtr(local_3b0);
    local_3b0 = local_3b0 + 1;
  } while (local_3b0 != (ArrayPtr<const_char> *)&argNames_stack[7].size_);
  if ((argNames_stack[7].size_._7_1_ & 1) == 0) {
    heapArray<kj::ArrayPtr<char_const>>
              ((Array<kj::ArrayPtr<const_char>_> *)&argNames.size_,this,size);
  }
  else {
    Array<kj::ArrayPtr<const_char>_>::Array
              ((Array<kj::ArrayPtr<const_char>_> *)&argNames.size_,(void *)0x0);
  }
  if ((argNames_stack[7].size_._7_1_ & 1) == 0) {
    AVar12 = kj::Array::operator_cast_to_ArrayPtr((Array *)&argNames.size_);
  }
  else {
    AVar12 = arrayPtr<kj::ArrayPtr<char_const>>
                       ((ArrayPtr<const_char> *)&argNames_heap.disposer,(size_t)this);
  }
  argNames.ptr = (ArrayPtr<const_char> *)AVar12.size_;
  local_f0 = (undefined1  [8])AVar12.ptr;
  sVar4 = ArrayPtr<kj::String>::size(&argValues);
  if (sVar4 != 0) {
    start = (char *)0x0;
    pos = (char *)argNames_size;
    while( true ) {
      iVar3 = isspace((int)*pos);
      if (iVar3 == 0) break;
      pos = pos + 1;
    }
    pcStack_118 = pos;
    local_11c = 0;
    local_11d = 0;
    do {
      do {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                pcVar7 = start;
                pcVar11 = pcStack_118 + 1;
                local_11e = *pcStack_118;
                if (local_11e == '\0') goto LAB_001d819e;
                if ((local_11d & 1) == 0) break;
                if ((local_11e == '\\') && (*pcVar11 != '\0')) {
                  pcStack_118 = pcStack_118 + 2;
                }
                else {
                  pcStack_118 = pcVar11;
                  if (local_11e == '\"') {
                    local_11d = 0;
                  }
                }
              }
              if (local_11e != '(') break;
              local_11c = local_11c + 1;
              pcStack_118 = pcVar11;
            }
            if (local_11e != ')') break;
            local_11c = local_11c + -1;
            pcStack_118 = pcVar11;
          }
          if (local_11e != '\"') break;
          local_11d = 1;
          pcStack_118 = pcVar11;
        }
        pcStack_118 = pcVar11;
      } while ((local_11e != ',') || (local_11c != 0));
      pcVar11 = (char *)ArrayPtr<kj::String>::size(&argValues);
      if (pcVar7 < pcVar11) {
        AVar13 = arrayPtr<char_const>(pos,pcStack_118 + -1);
        pcVar7 = start;
        start = start + 1;
        local_130 = AVar13;
        pAVar5 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                           ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,(size_t)pcVar7);
        *pAVar5 = local_130;
      }
      while( true ) {
        iVar3 = isspace((int)*pcStack_118);
        if (iVar3 == 0) break;
        pcStack_118 = pcStack_118 + 1;
      }
      pos = pcStack_118;
      pcVar11 = pcStack_118;
    } while (*pcStack_118 != '\0');
LAB_001d819e:
    pcStack_118 = pcVar11;
    pcVar7 = start;
    pcVar11 = (char *)ArrayPtr<kj::String>::size(&argValues);
    if (pcVar7 < pcVar11) {
      local_140 = arrayPtr<char_const>(pos,pcStack_118 + -1);
      pcVar7 = start;
      start = start + 1;
      pAVar5 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                         ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,(size_t)pcVar7);
      *pAVar5 = local_140;
    }
    pcVar7 = start;
    pcVar11 = (char *)ArrayPtr<kj::String>::size(&argValues);
    if (pcVar7 != pcVar11) {
      pEVar6 = getExceptionCallback();
      local_160 = ArrayPtr<kj::String>::size(&argValues);
      equalsPos._7_1_ = 10;
      str<char_const(&)[41],unsigned_long,char_const(&)[9],char_const*&,char>
                (&local_158,(kj *)"Failed to parse logging macro args into ",
                 (char (*) [41])&local_160,(unsigned_long *)" names: ",(char (*) [9])&argNames_size,
                 (char **)((long)&equalsPos + 7),in_stack_fffffffffffff9c8);
      (*pEVar6->_vptr_ExceptionCallback[4])
                (pEVar6,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug.c++"
                 ,0xdd,0,&local_158);
      String::~String(&local_158);
    }
  }
  if (code_local._4_4_ == SYSCALL) {
    pcVar7 = strchr(pcStack_20,0x3d);
    if ((pcVar7 != (char *)0x0) && (pcVar7[1] != '=')) {
      do {
        pcStack_20 = pcVar7 + 1;
        iVar3 = isspace((int)*pcStack_20);
        pcVar7 = pcStack_20;
      } while (iVar3 != 0);
    }
  }
  if ((code_local._4_4_ == ASSERTION) && (pcStack_20 == (char *)0x0)) {
    code_local._4_4_ = LOG;
  }
  StringPtr::StringPtr((StringPtr *)&codeArray.content.size_,"expected ");
  if (code_local._4_4_ == LOG) {
    StringPtr::StringPtr((StringPtr *)&sep.content.size_,(void *)0x0);
  }
  else {
    StringPtr::StringPtr((StringPtr *)&sep.content.size_,pcStack_20);
  }
  StringPtr::StringPtr((StringPtr *)&delim.content.size_," = ");
  StringPtr::StringPtr((StringPtr *)&colon.content.size_,"; ");
  StringPtr::StringPtr((StringPtr *)&openBracket.content.size_,": ");
  StringPtr::StringPtr((StringPtr *)&closeBracket.content.size_," [");
  StringPtr::StringPtr((StringPtr *)&sysErrorArray.content.size_,"]");
  StringPtr::StringPtr((StringPtr *)local_1f0);
  memset(local_2f8,0,0x100);
  if (code_local._4_4_ == SYSCALL) {
    if (macroArgs_local == (char *)0x0) {
      pcVar7 = strerror_r(sysErrorString_local._4_4_,local_2f8,0x100);
      StringPtr::StringPtr(&local_308,pcVar7);
      local_1f0 = (undefined1  [8])local_308.content.ptr;
      sysErrorArray.content.ptr = (char *)local_308.content.size_;
    }
    else {
      StringPtr::StringPtr((StringPtr *)&totalSize,macroArgs_local);
      local_1f0 = (undefined1  [8])totalSize;
      sysErrorArray.content.ptr = local_310;
    }
  }
  sStack_320 = 0;
  if (code_local._4_4_ != LOG) {
    if (code_local._4_4_ == ASSERTION) {
      sVar4 = StringPtr::size((StringPtr *)&codeArray.content.size_);
      sVar9 = StringPtr::size((StringPtr *)&sep.content.size_);
      sStack_320 = sVar4 + sVar9 + sStack_320;
    }
    else if (code_local._4_4_ == SYSCALL) {
      sVar4 = StringPtr::size((StringPtr *)&sep.content.size_);
      sVar9 = StringPtr::size((StringPtr *)&openBracket.content.size_);
      sVar8 = StringPtr::size((StringPtr *)local_1f0);
      sStack_320 = sVar4 + sVar9 + sVar8 + sStack_320;
    }
  }
  i._7_1_ = 0;
  local_330 = 0;
  while( true ) {
    uVar1 = local_330;
    sVar4 = ArrayPtr<kj::String>::size(&argValues);
    if (sVar4 <= uVar1) break;
    pAVar5 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                       ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,local_330);
    AVar13 = (ArrayPtr<const_char>)operator____kj("_kjCondition",0xc);
    local_350 = AVar13;
    AVar13 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&local_350);
    local_340 = AVar13;
    bVar2 = ArrayPtr<const_char>::operator==(pAVar5,&local_340);
    if (bVar2) {
      pSVar10 = ArrayPtr<kj::String>::operator[](&argValues,local_330);
      StringPtr::StringPtr(&local_360,"false");
      bVar2 = String::operator==(pSVar10,&local_360);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        sVar4 = StringPtr::size((StringPtr *)&closeBracket.content.size_);
        pSVar10 = ArrayPtr<kj::String>::operator[](&argValues,local_330);
        sVar9 = String::size(pSVar10);
        sVar8 = StringPtr::size((StringPtr *)&sysErrorArray.content.size_);
        sStack_320 = sVar4 + sVar9 + sVar8 + sStack_320;
      }
    }
    else {
      if ((local_330 != 0) || (code_local._4_4_ != LOG)) {
        sVar4 = StringPtr::size((StringPtr *)&colon.content.size_);
        sStack_320 = sVar4 + sStack_320;
      }
      pAVar5 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                         ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,local_330);
      bVar2 = makeDescriptionImpl::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&i + 7),pAVar5);
      if (bVar2) {
        pAVar5 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                           ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,local_330);
        sVar4 = ArrayPtr<const_char>::size(pAVar5);
        sVar9 = StringPtr::size((StringPtr *)&delim.content.size_);
        sStack_320 = sVar4 + sVar9 + sStack_320;
      }
      pSVar10 = ArrayPtr<kj::String>::operator[](&argValues,local_330);
      sVar4 = String::size(pSVar10);
      sStack_320 = sVar4 + sStack_320;
    }
    local_330 = local_330 + 1;
  }
  pos_1._7_1_ = 0;
  heapString(__return_storage_ptr__,sStack_320);
  i_1 = (size_t)String::begin(__return_storage_ptr__);
  if (code_local._4_4_ != LOG) {
    if (code_local._4_4_ == ASSERTION) {
      i_1 = (size_t)fill<kj::StringPtr,kj::StringPtr&>
                              ((char *)i_1,(StringPtr *)&codeArray.content.size_,
                               (StringPtr *)&sep.content.size_);
    }
    else if (code_local._4_4_ == SYSCALL) {
      i_1 = (size_t)fill<kj::StringPtr,kj::StringPtr&,kj::StringPtr&>
                              ((char *)i_1,(StringPtr *)&sep.content.size_,
                               (StringPtr *)&openBracket.content.size_,(StringPtr *)local_1f0);
    }
  }
  local_378 = 0;
  while( true ) {
    uVar1 = local_378;
    sVar4 = ArrayPtr<kj::String>::size(&argValues);
    if (sVar4 <= uVar1) break;
    pAVar5 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                       ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,local_378);
    AVar13 = (ArrayPtr<const_char>)operator____kj("_kjCondition",0xc);
    local_398 = AVar13;
    AVar13 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&local_398);
    local_388 = AVar13;
    bVar2 = ArrayPtr<const_char>::operator==(pAVar5,&local_388);
    if (bVar2) {
      pSVar10 = ArrayPtr<kj::String>::operator[](&argValues,local_378);
      StringPtr::StringPtr(&local_3a8,"false");
      bVar2 = String::operator==(pSVar10,&local_3a8);
      sVar4 = i_1;
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        pSVar10 = ArrayPtr<kj::String>::operator[](&argValues,local_378);
        i_1 = (size_t)fill<kj::StringPtr,kj::String&,kj::StringPtr&>
                                ((char *)sVar4,(StringPtr *)&closeBracket.content.size_,pSVar10,
                                 (StringPtr *)&sysErrorArray.content.size_);
      }
    }
    else {
      if ((local_378 != 0) || (code_local._4_4_ != LOG)) {
        i_1 = (size_t)fill<kj::StringPtr>((char *)i_1,(StringPtr *)&colon.content.size_);
      }
      pAVar5 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                         ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,local_378);
      bVar2 = makeDescriptionImpl::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&i + 7),pAVar5);
      sVar4 = i_1;
      if (bVar2) {
        pAVar5 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                           ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_f0,local_378);
        i_1 = (size_t)fill<kj::ArrayPtr<char_const>,kj::StringPtr&>
                                ((char *)sVar4,pAVar5,(StringPtr *)&delim.content.size_);
      }
      sVar4 = i_1;
      pSVar10 = ArrayPtr<kj::String>::operator[](&argValues,local_378);
      i_1 = (size_t)fill<kj::String>((char *)sVar4,pSVar10);
    }
    local_378 = local_378 + 1;
  }
  pos_1._7_1_ = 1;
  Array<kj::ArrayPtr<const_char>_>::~Array((Array<kj::ArrayPtr<const_char>_> *)&argNames.size_);
  return __return_storage_ptr__;
}

Assistant:

static String makeDescriptionImpl(DescriptionStyle style, const char* code, int errorNumber,
                                  const char* sysErrorString, const char* macroArgs,
                                  ArrayPtr<String> argValues) {
  KJ_STACK_ARRAY(ArrayPtr<const char>, argNames, argValues.size(), 8, 64);

  if (argValues.size() > 0) {
    size_t index = 0;
    const char* start = macroArgs;
    while (isspace(*start)) ++start;
    const char* pos = start;
    uint depth = 0;
    bool quoted = false;
    while (char c = *pos++) {
      if (quoted) {
        if (c == '\\' && *pos != '\0') {
          ++pos;
        } else if (c == '\"') {
          quoted = false;
        }
      } else {
        if (c == '(') {
          ++depth;
        } else if (c == ')') {
          --depth;
        } else if (c == '\"') {
          quoted = true;
        } else if (c == ',' && depth == 0) {
          if (index < argValues.size()) {
            argNames[index++] = arrayPtr(start, pos - 1);
          }
          while (isspace(*pos)) ++pos;
          start = pos;
          if (*pos == '\0') {
            // ignore trailing comma
            break;
          }
        }
      }
    }
    if (index < argValues.size()) {
      argNames[index++] = arrayPtr(start, pos - 1);
    }

    if (index != argValues.size()) {
      getExceptionCallback().logMessage(LogSeverity::ERROR, __FILE__, __LINE__, 0,
          str("Failed to parse logging macro args into ",
              argValues.size(), " names: ", macroArgs, '\n'));
    }
  }

  if (style == SYSCALL) {
    // Strip off leading "foo = " from code, since callers will sometimes write things like:
    //   ssize_t n;
    //   RECOVERABLE_SYSCALL(n = read(fd, buffer, sizeof(buffer))) { return ""; }
    //   return std::string(buffer, n);
    const char* equalsPos = strchr(code, '=');
    if (equalsPos != nullptr && equalsPos[1] != '=') {
      code = equalsPos + 1;
      while (isspace(*code)) ++code;
    }
  }

  if (style == ASSERTION && code == nullptr) {
    style = LOG;
  }

  {
    StringPtr expected = "expected ";
    StringPtr codeArray = style == LOG ? nullptr : StringPtr(code);
    StringPtr sep = " = ";
    StringPtr delim = "; ";
    StringPtr colon = ": ";
    StringPtr openBracket = " [";
    StringPtr closeBracket = "]";

    StringPtr sysErrorArray;
// On android before marshmallow only the posix version of stderror_r was
// available, even with __USE_GNU.
#if __USE_GNU && !(defined(__ANDROID_API__) && __ANDROID_API__ < 23)
    char buffer[256]{};
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        sysErrorArray = strerror_r(errorNumber, buffer, sizeof(buffer));
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#else
    char buffer[256];
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        strerror_r(errorNumber, buffer, sizeof(buffer));
        sysErrorArray = buffer;
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#endif

    size_t totalSize = 0;
    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        totalSize += expected.size() + codeArray.size();
        break;
      case SYSCALL:
        totalSize += codeArray.size() + colon.size() + sysErrorArray.size();
        break;
    }

    auto needsLabel = [](const ArrayPtr<const char> &argName) -> bool {
      return argName.size() > 0 && argName[0] != '\"' && !argName.startsWith("kj::str("_kjc);
    };

    for (size_t i = 0; i < argValues.size(); i++) {
      if (argNames[i] == "_kjCondition"_kj) {
        // Special handling: don't output delimiter, we want to append this to the previous item,
        // in brackets. Also, if it's just "[false]" (meaning we didn't manage to extract a
        // comparison), don't add it at all.
        if (argValues[i] != "false") {
          totalSize += openBracket.size() + argValues[i].size() + closeBracket.size();
        }
        continue;
      }

      if (i > 0 || style != LOG) {
        totalSize += delim.size();
      }
      if (needsLabel(argNames[i])) {
        totalSize += argNames[i].size() + sep.size();
      }
      totalSize += argValues[i].size();
    }

    String result = heapString(totalSize);
    char* pos = result.begin();

    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        pos = _::fill(pos, expected, codeArray);
        break;
      case SYSCALL:
        pos = _::fill(pos, codeArray, colon, sysErrorArray);
        break;
    }

    for (size_t i = 0; i < argValues.size(); i++) {
      if (argNames[i] == "_kjCondition"_kj) {
        // Special handling: don't output delimiter, we want to append this to the previous item,
        // in brackets. Also, if it's just "[false]" (meaning we didn't manage to extract a
        // comparison), don't add it at all.
        if (argValues[i] != "false") {
          pos = _::fill(pos, openBracket, argValues[i], closeBracket);
        }
        continue;
      }

      if (i > 0 || style != LOG) {
        pos = _::fill(pos, delim);
      }
      if (needsLabel(argNames[i])) {
        pos = _::fill(pos, argNames[i], sep);
      }
      pos = _::fill(pos, argValues[i]);
    }

    return result;
  }
}